

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiInstCount(Fts5Context *pCtx,int *pnInst)

{
  int local_24;
  int rc;
  Fts5Cursor *pCsr;
  int *pnInst_local;
  Fts5Context *pCtx_local;
  
  local_24 = 0;
  if (((*(uint *)(pCtx + 0x50) & 8) != 0) &&
     (local_24 = fts5CacheInstArray((Fts5Cursor *)pCtx), local_24 != 0)) {
    return local_24;
  }
  *pnInst = *(int *)(pCtx + 0xac);
  return local_24;
}

Assistant:

static int fts5ApiInstCount(Fts5Context *pCtx, int *pnInst){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int rc = SQLITE_OK;
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_INST)==0 
   || SQLITE_OK==(rc = fts5CacheInstArray(pCsr)) ){
    *pnInst = pCsr->nInstCount;
  }
  return rc;
}